

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O0

Expression *
slang::ast::CallExpression::fromArgs
          (Compilation *compilation,Subroutine *subroutine,Expression *thisClass,
          ArgumentListSyntax *argSyntax,SourceRange range,ASTContext *context)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange range_00;
  bool bVar1;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar2;
  SubroutineSymbol *sub;
  CallExpression *pCVar3;
  long lVar4;
  Symbol *pSVar5;
  ProceduralBlockSymbol *pPVar6;
  uint32_t uVar7;
  long in_RDX;
  EVP_PKEY_CTX *src;
  SourceRange *extraout_RDX;
  EVP_PKEY_CTX *in_RDI;
  Scope *in_R8;
  Compilation *in_R9;
  uint uVar8;
  LookupLocation LVar9;
  long in_stack_00000008;
  ProceduralBlockSymbol *proc;
  Scope *scope;
  CallExpression *result;
  bool bad;
  SubroutineSymbol *symbol;
  SmallVector<const_slang::ast::Expression_*,_5UL> boundArgs;
  undefined1 in_stack_0000039f;
  ASTContext *in_stack_000003a0;
  ArgumentListSyntax *in_stack_000003a8;
  string_view in_stack_000003b0;
  span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> in_stack_000003c0;
  SourceRange in_stack_00000580;
  SmallVectorBase<const_slang::ast::Expression_*> *in_stack_00000590;
  SubroutineSymbol *in_stack_fffffffffffffd58;
  ASTContext *this;
  bitmask<slang::ast::MethodFlags> *in_stack_fffffffffffffd60;
  Compilation *compilation_00;
  SmallVectorBase<const_slang::ast::Expression_*> *r;
  undefined4 in_stack_fffffffffffffd74;
  ASTContext *in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  SourceLocation in_stack_fffffffffffffd88;
  undefined8 in_stack_fffffffffffffd90;
  DiagCode code;
  Scope *in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  undefined1 in_stack_fffffffffffffde7;
  ASTContext *in_stack_fffffffffffffde8;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> *in_stack_fffffffffffffdf0;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  undefined1 uVar10;
  Type *in_stack_fffffffffffffe00;
  SubroutineSymbol **in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  SourceRange *args_5;
  Scope *local_128;
  undefined4 in_stack_fffffffffffffefc;
  uint32_t uVar11;
  undefined4 in_stack_ffffffffffffff0c;
  bitmask<slang::ast::MethodFlags> local_ca;
  Scope *local_c8;
  Compilation *pCStack_c0;
  size_t local_b8;
  char *pcStack_b0;
  ArgList local_a0;
  byte local_8d;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> local_80;
  SmallVectorBase<const_slang::ast::Expression_*> local_78 [2];
  long local_30;
  EVP_PKEY_CTX *local_20;
  undefined1 local_18 [16];
  bitmask<slang::ast::ASTFlags> local_8;
  
  local_30 = in_RDX;
  local_20 = in_RDI;
  local_18._0_8_ = in_R8;
  local_18._8_8_ = in_R9;
  SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x802b7c);
  ppSVar2 = std::
            get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                      ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        *)0x802b89);
  local_80 = *ppSVar2;
  local_a0 = SubroutineSymbol::getArguments(in_stack_fffffffffffffd58);
  local_b8 = (local_80->super_Symbol).name._M_len;
  pcStack_b0 = (local_80->super_Symbol).name._M_str;
  local_c8 = (Scope *)local_18._0_8_;
  pCStack_c0 = (Compilation *)local_18._8_8_;
  bitmask<slang::ast::MethodFlags>::bitmask(&local_ca,BuiltIn);
  bVar1 = bitmask<slang::ast::MethodFlags>::has
                    (in_stack_fffffffffffffd60,
                     (bitmask<slang::ast::MethodFlags> *)in_stack_fffffffffffffd58);
  uVar8 = (uint)bVar1;
  r = local_78;
  compilation_00 = pCStack_c0;
  bVar1 = bindArgs(in_stack_000003a8,in_stack_000003c0,in_stack_000003b0,in_stack_00000580,
                   in_stack_000003a0,in_stack_00000590,(bool)in_stack_0000039f);
  local_8d = ~bVar1 & 1;
  SubroutineSymbol::getReturnType((SubroutineSymbol *)0x802d10);
  SmallVectorBase<const_slang::ast::Expression_*>::copy(local_78,local_20,src);
  args_5 = extraout_RDX;
  LVar9 = ASTContext::getLocation((ASTContext *)compilation_00);
  sub = (SubroutineSymbol *)LVar9.scope;
  uVar7 = LVar9.index;
  this = (ASTContext *)local_18;
  uVar11 = uVar7;
  pCVar3 = BumpAllocator::
           emplace<slang::ast::CallExpression,slang::ast::SubroutineSymbol_const*,slang::ast::Type_const&,slang::ast::Expression_const*&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::LookupLocation,slang::SourceRange&>
                     ((BumpAllocator *)CONCAT44(uVar7,in_stack_fffffffffffffe10),
                      in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                      (Expression **)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                      in_stack_fffffffffffffdf0,(LookupLocation *)in_stack_fffffffffffffde8,args_5);
  if ((local_8d & 1) != 0) {
    local_8.m_bits = (underlying_type)Expression::badExpr(compilation_00,(Expression *)this);
    goto LAB_008031ea;
  }
  lVar4 = in_stack_00000008 + 0x10;
  ast::operator|((ASTFlags)r,(ASTFlags)compilation_00);
  bVar1 = bitmask<slang::ast::ASTFlags>::has
                    ((bitmask<slang::ast::ASTFlags> *)CONCAT44(in_stack_fffffffffffffd74,uVar8),
                     (bitmask<slang::ast::ASTFlags> *)r);
  uVar10 = false;
  if (bVar1) {
    uVar10 = local_80->subroutineKind == Task;
  }
  if ((bool)uVar10 == false) {
    SubroutineSymbol::hasOutputArgs
              ((SubroutineSymbol *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
    range_00.endLoc._0_7_ = in_stack_fffffffffffffdf8;
    range_00.startLoc = (SourceLocation)lVar4;
    range_00.endLoc._7_1_ = uVar10;
    bVar1 = checkOutputArgs(in_stack_fffffffffffffde8,(bool)in_stack_fffffffffffffde7,range_00);
    if (bVar1) {
      local_8.m_bits = (underlying_type)pCVar3;
      if ((local_30 == 0) && (local_80->subroutineKind == Function)) {
        pPVar6 = ASTContext::getProceduralBlock(this);
        if (pPVar6 != (ProceduralBlockSymbol *)0x0) {
          not_null<const_slang::ast::Scope_*>::operator->
                    ((not_null<const_slang::ast::Scope_*> *)0x80318b);
          bVar1 = Scope::isUninstantiated(in_stack_fffffffffffffd98);
          if (!bVar1) {
            addSubroutineDrivers
                      ((Symbol *)CONCAT44(in_stack_ffffffffffffff0c,uVar11),sub,
                       (Expression *)CONCAT44(in_stack_fffffffffffffefc,uVar7));
          }
        }
      }
    }
    else {
      local_8.m_bits = (underlying_type)Expression::badExpr(compilation_00,(Expression *)this);
    }
    goto LAB_008031ea;
  }
  local_128 = not_null::operator_cast_to_Scope_((not_null<const_slang::ast::Scope_*> *)0x802f0f);
  while( true ) {
    bVar1 = false;
    if (local_128 != (Scope *)0x0) {
      pSVar5 = Scope::asSymbol(local_128);
      bVar1 = pSVar5->kind == StatementBlock;
    }
    code = SUB84((ulong)in_stack_fffffffffffffd90 >> 0x20,0);
    if (!bVar1) break;
    pSVar5 = Scope::asSymbol(local_128);
    local_128 = Symbol::getParentScope(pSVar5);
  }
  if (local_128 == (Scope *)0x0) {
LAB_00803019:
    sourceRange_00.startLoc._7_1_ = in_stack_fffffffffffffd87;
    sourceRange_00.startLoc._0_7_ = in_stack_fffffffffffffd80;
    sourceRange_00.endLoc = in_stack_fffffffffffffd88;
    ASTContext::addDiag(in_stack_fffffffffffffd78,code,sourceRange_00);
  }
  else {
    pSVar5 = Scope::asSymbol(local_128);
    if (pSVar5->kind != Subroutine) goto LAB_00803019;
    sourceRange.startLoc._7_1_ = in_stack_fffffffffffffd87;
    sourceRange.startLoc._0_7_ = in_stack_fffffffffffffd80;
    sourceRange.endLoc = in_stack_fffffffffffffd88;
    ASTContext::addDiag(in_stack_fffffffffffffd78,code,sourceRange);
  }
  local_8.m_bits = (underlying_type)Expression::badExpr(compilation_00,(Expression *)this);
LAB_008031ea:
  SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x8031f7);
  return &((CallExpression *)local_8.m_bits)->super_Expression;
}

Assistant:

Expression& CallExpression::fromArgs(Compilation& compilation, const Subroutine& subroutine,
                                     const Expression* thisClass,
                                     const ArgumentListSyntax* argSyntax, SourceRange range,
                                     const ASTContext& context) {
    SmallVector<const Expression*> boundArgs;
    const SubroutineSymbol& symbol = *std::get<0>(subroutine);
    bool bad = !bindArgs(argSyntax, symbol.getArguments(), symbol.name, range, context, boundArgs,
                         symbol.flags.has(MethodFlags::BuiltIn));

    auto result = compilation.emplace<CallExpression>(&symbol, symbol.getReturnType(), thisClass,
                                                      boundArgs.copy(compilation),
                                                      context.getLocation(), range);
    if (bad)
        return badExpr(compilation, result);

    if (context.flags.has(ASTFlags::Function | ASTFlags::Final) &&
        symbol.subroutineKind == SubroutineKind::Task) {
        const Scope* scope = context.scope;
        while (scope && scope->asSymbol().kind == SymbolKind::StatementBlock)
            scope = scope->asSymbol().getParentScope();

        if (scope && scope->asSymbol().kind == SymbolKind::Subroutine)
            context.addDiag(diag::TaskFromFunction, range);
        else
            context.addDiag(diag::TaskFromFinal, range);

        return badExpr(compilation, result);
    }

    if (!checkOutputArgs(context, symbol.hasOutputArgs(), range))
        return badExpr(compilation, result);

    // If this subroutine is invoked from a procedure, register drivers for this
    // particular procedure to detect multiple driver violations.
    if (!thisClass && symbol.subroutineKind == SubroutineKind::Function) {
        if (auto proc = context.getProceduralBlock(); proc && !context.scope->isUninstantiated())
            addSubroutineDrivers(*proc, symbol, *result);
    }

    return *result;
}